

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

double __thiscall Minisat::Solver::progressEstimate(Solver *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Solver *in_RDI;
  double dVar4;
  int end;
  int beg;
  int i;
  double F;
  double progress;
  int local_40;
  int local_38;
  int local_1c;
  double local_10;
  
  local_10 = 0.0;
  iVar1 = nVars(in_RDI);
  local_1c = 0;
  while( true ) {
    iVar2 = decisionLevel((Solver *)0xa388e1);
    if (iVar2 < local_1c) break;
    if (local_1c == 0) {
      local_38 = 0;
    }
    else {
      piVar3 = vec<int,_int>::operator[](&in_RDI->trail_lim,local_1c + -1);
      local_38 = *piVar3;
    }
    iVar2 = decisionLevel((Solver *)0xa38936);
    if (local_1c == iVar2) {
      local_40 = vec<Minisat::Lit,_int>::size(&in_RDI->trail);
    }
    else {
      piVar3 = vec<int,_int>::operator[](&in_RDI->trail_lim,local_1c);
      local_40 = *piVar3;
    }
    dVar4 = pow(1.0 / (double)iVar1,(double)local_1c);
    local_10 = dVar4 * (double)(local_40 - local_38) + local_10;
    local_1c = local_1c + 1;
  }
  iVar1 = nVars(in_RDI);
  return local_10 / (double)iVar1;
}

Assistant:

double Solver::progressEstimate() const
{
    double  progress = 0;
    double  F = 1.0 / nVars();

    for (int i = 0; i <= decisionLevel(); i++){
        int beg = i == 0 ? 0 : trail_lim[i - 1];
        int end = i == decisionLevel() ? trail.size() : trail_lim[i];
        progress += pow(F, i) * (end - beg);
    }

    return progress / nVars();
}